

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O2

void new_parsed_str(vm_val_t *ret,char *str,size_t len,int encmode)

{
  char *buf;
  CVmObjPageEntry *pCVar1;
  long lVar2;
  char cVar3;
  vm_obj_id_t vVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint16_t tmp;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  
  vVar4 = CVmObjString::create(0,str,len);
  ret->typ = VM_OBJ;
  (ret->val).obj = vVar4;
  pCVar1 = G_obj_table_X.pages_[vVar4 >> 0xc];
  lVar2 = *(long *)((long)&pCVar1[vVar4 & 0xfff].ptr_ + 8);
  buf = (char *)(lVar2 + 2);
  if (1 < encmode - 1U) {
LAB_00206492:
    CCharmapToUni::validate(buf,len);
    return;
  }
  pcVar11 = (char *)(lVar2 + len + 2);
  pcVar10 = buf;
  pcVar13 = buf;
  do {
    pcVar12 = pcVar13 + 6;
LAB_00206387:
    pcVar13 = pcVar12 + -6;
    if (pcVar11 <= pcVar13) {
      len = (long)pcVar10 - (long)buf;
      **(undefined2 **)((long)&pCVar1[vVar4 & 0xfff].ptr_ + 8) = (short)len;
      goto LAB_00206492;
    }
    cVar3 = *pcVar13;
    if (cVar3 != '%') {
LAB_002063c3:
      if (cVar3 == '\r') {
        if (encmode != 2) {
          cVar3 = '\r';
          goto LAB_002063f5;
        }
      }
      else {
        if (cVar3 == '+') {
          *pcVar10 = ' ';
          pcVar13 = pcVar12 + -5;
          goto LAB_002063fb;
        }
        if ((encmode != 2) || (cVar3 != '\n')) goto LAB_002063f5;
      }
      pcVar12 = pcVar12 + 1;
      goto LAB_00206387;
    }
    if (pcVar12 + -4 < pcVar11) {
      iVar5 = is_xdigit((int)pcVar12[-5]);
      if ((iVar5 != 0) && (iVar5 = is_xdigit((int)pcVar12[-4]), iVar5 != 0)) {
        iVar6 = (int)pcVar12[-5];
        iVar5 = -0x30;
        if (0x40 < iVar6) {
          iVar5 = -0x37;
        }
        if (0x60 < iVar6) {
          iVar5 = -0x57;
        }
        iVar9 = (int)pcVar12[-4];
        iVar7 = -0x30;
        if (0x40 < iVar9) {
          iVar7 = -0x37;
        }
        if (0x60 < iVar9) {
          iVar7 = -0x57;
        }
        uVar8 = iVar7 + iVar9 | (iVar5 + iVar6) * 0x10;
        cVar3 = (char)uVar8;
        pcVar13 = pcVar12 + -3;
        if (uVar8 == 0xd) {
          if (pcVar12 + -1 < pcVar11) {
            iVar5 = memicmp(pcVar13,"%0a",3);
            if (iVar5 == 0) {
              pcVar13 = pcVar12;
            }
            cVar3 = (iVar5 != 0) * '\x03' + '\n';
          }
          else {
            cVar3 = '\r';
          }
        }
        *pcVar10 = cVar3;
        goto LAB_002063fb;
      }
      cVar3 = *pcVar13;
      goto LAB_002063c3;
    }
    cVar3 = '%';
LAB_002063f5:
    pcVar13 = pcVar12 + -5;
    *pcVar10 = cVar3;
LAB_002063fb:
    pcVar10 = pcVar10 + 1;
  } while( true );
}

Assistant:

static void new_parsed_str(VMG_ vm_val_t *ret, const char *str, size_t len,
                           int encmode)
{
    char *src, *dst;

    /* create the raw string */
    ret->set_obj(CVmObjString::create(vmg_ FALSE, str, len));
    CVmObjString *s = (CVmObjString *)vm_objp(vmg_ ret->val.obj);

    /* get the string buffer */
    char *buf = s->cons_get_buf();
    char *bufend = buf + len;

    /* 
     *   if desired, decode url-encoding: run through the string, converting
     *   '%xx' sequences to bytes, and '+' characters to spaces
     */
    if (encmode == ENCMODE_URL || encmode == ENCMODE_FORM)
    {
        for (src = dst = buf ; src < bufend ; )
        {
            /* if this is a '%xx' sequence, convert it */
            if (*src == '%' && src + 2 < bufend
                && is_xdigit(*(src+1)) && is_xdigit(*(src+2)))
            {
                /* generate the character value */
                int c = (value_of_xdigit(*(src+1)) << 4)
                        | value_of_xdigit(*(src+2));

                /* skip the three-character %xx sequence */
                src += 3;

                /* 
                 *   if this is an encoded CR, and an LF follows, decode the
                 *   whole sequence to a single '\n' 
                 */
                if (c == '\r'
                    && src + 2 < bufend
                    && memicmp(src, "%0a", 3) == 0)
                {
                    /* change to '\n' */
                    c = '\n';

                    /* skip the in the source */
                    src += 3;
                }
                
                /* set the character in the output */
                *dst++ = (char)(unsigned char)c;
            }
            else if (*src == '+'
                     && (encmode == ENCMODE_FORM || encmode == ENCMODE_URL))
            {
                /* for form data, translate + to space */
                *dst++ = ' ';
                ++src;
            }
            else if ((*src == '\r' || *src == '\n')
                     && encmode == ENCMODE_FORM)
            {
                /* for form data, strip out newlines */
                ++src;
            }
            else
            {
                /* ordinary character - copy as-is */
                *dst++ = *src++;
            }
        }
        
        /* 
         *   update the length - the string might have contracted, since
         *   '%xx' sequences might have turned into single bytes 
         */
        len = dst - buf;
        bufend = dst;
        s->cons_set_len(len);
    }
    else if (encmode == ENCMODE_MIME)
    {
        // $$$ decode the MIME ?= encoding
    }

    /* ensure that the buffer has only well-formed UTF-8 characters */
    CCharmapToUni::validate(buf, bufend - buf);
}